

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void highbd_write_buffer_8xn_sse4_1
               (__m128i *in,uint16_t *output,int stride,int flipud,int height,int bd)

{
  __m128i *palVar1;
  uint uVar2;
  __m128i *palVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  bool bVar7;
  int iVar8;
  int iVar10;
  int iVar11;
  undefined1 auVar9 [16];
  int iVar12;
  int iVar15;
  int iVar16;
  undefined1 in_XMM3 [16];
  undefined1 auVar13 [16];
  int iVar17;
  undefined1 auVar14 [16];
  
  iVar5 = height + -1;
  if (flipud == 0) {
    iVar5 = 0;
  }
  uVar6 = ~(-1 << ((byte)bd & 0x1f));
  uVar2 = 0;
  if (0 < height) {
    uVar2 = height;
  }
  uVar4 = (ulong)uVar2;
  palVar3 = in + iVar5;
  while (bVar7 = uVar4 != 0, uVar4 = uVar4 - 1, bVar7) {
    auVar9 = *(undefined1 (*) [16])output;
    auVar13 = pmovsxwd(in_XMM3,auVar9);
    auVar9._0_8_ = auVar9._8_8_;
    auVar9 = pmovsxwd(auVar9,auVar9);
    iVar5 = auVar13._0_4_ + (int)(*palVar3)[0];
    iVar15 = auVar13._4_4_ + *(int *)((long)*palVar3 + 4);
    iVar16 = auVar13._8_4_ + (int)(*palVar3)[1];
    iVar17 = auVar13._12_4_ + *(int *)((long)*palVar3 + 0xc);
    palVar1 = palVar3 + height;
    iVar8 = auVar9._0_4_ + (int)(*palVar1)[0];
    iVar10 = auVar9._4_4_ + *(int *)((long)*palVar1 + 4);
    iVar11 = auVar9._8_4_ + (int)(*palVar1)[1];
    iVar12 = auVar9._12_4_ + *(int *)((long)*palVar1 + 0xc);
    iVar5 = (uint)(-1 < iVar5) * iVar5;
    iVar15 = (uint)(-1 < iVar15) * iVar15;
    iVar16 = (uint)(-1 < iVar16) * iVar16;
    iVar17 = (uint)(-1 < iVar17) * iVar17;
    auVar14._0_4_ = ((int)uVar6 < iVar5) * uVar6 | (uint)((int)uVar6 >= iVar5) * iVar5;
    auVar14._4_4_ = ((int)uVar6 < iVar15) * uVar6 | (uint)((int)uVar6 >= iVar15) * iVar15;
    auVar14._8_4_ = ((int)uVar6 < iVar16) * uVar6 | (uint)((int)uVar6 >= iVar16) * iVar16;
    auVar14._12_4_ = ((int)uVar6 < iVar17) * uVar6 | (uint)((int)uVar6 >= iVar17) * iVar17;
    iVar8 = (uint)(-1 < iVar8) * iVar8;
    iVar10 = (uint)(-1 < iVar10) * iVar10;
    iVar11 = (uint)(-1 < iVar11) * iVar11;
    iVar12 = (uint)(-1 < iVar12) * iVar12;
    auVar13._0_4_ = ((int)uVar6 < iVar8) * uVar6 | (uint)((int)uVar6 >= iVar8) * iVar8;
    auVar13._4_4_ = ((int)uVar6 < iVar10) * uVar6 | (uint)((int)uVar6 >= iVar10) * iVar10;
    auVar13._8_4_ = ((int)uVar6 < iVar11) * uVar6 | (uint)((int)uVar6 >= iVar11) * iVar11;
    auVar13._12_4_ = ((int)uVar6 < iVar12) * uVar6 | (uint)((int)uVar6 >= iVar12) * iVar12;
    in_XMM3 = packusdw(auVar14,auVar13);
    *(undefined1 (*) [16])output = in_XMM3;
    palVar3 = palVar3 + (ulong)(flipud == 0) * 2 + -1;
    output = (uint16_t *)(*(undefined1 (*) [16])output + (long)stride * 2);
  }
  return;
}

Assistant:

static inline void highbd_write_buffer_8xn_sse4_1(__m128i *in, uint16_t *output,
                                                  int stride, int flipud,
                                                  int height, const int bd) {
  int j = flipud ? (height - 1) : 0;
  const int step = flipud ? -1 : 1;
  for (int i = 0; i < height; ++i, j += step) {
    __m128i v = _mm_loadu_si128((__m128i const *)(output + i * stride));
    __m128i u = highbd_get_recon_8x8_sse4_1(v, in[j], in[j + height], bd);

    _mm_storeu_si128((__m128i *)(output + i * stride), u);
  }
}